

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_unpack.cpp
# Opt level: O1

int Unpack_UnnamedMarkers(char **pptr,sFrameOfData *Frame)

{
  int iVar1;
  int *piVar2;
  tMarkerData *pafVar3;
  size_t __size;
  
  piVar2 = (int *)*pptr;
  iVar1 = *piVar2;
  __size = (size_t)(iVar1 * 0xc);
  if (iVar1 != Frame->nUnidentifiedMarkers) {
    Frame->nUnidentifiedMarkers = iVar1;
    pafVar3 = (tMarkerData *)realloc(Frame->UnidentifiedMarkers,__size);
    Frame->UnidentifiedMarkers = pafVar3;
  }
  memcpy(Frame->UnidentifiedMarkers,piVar2 + 1,__size);
  *pptr = (char *)((long)piVar2 + __size + 4);
  return iVar1 * 0xc + 4;
}

Assistant:

int Unpack_UnnamedMarkers(char **pptr, sFrameOfData *Frame)
{
  char *ptr = *pptr;
  int nBytes = 0;
  int nTotalBytes = 0;
  int nMarkers;

  memcpy(&nMarkers, ptr, 4);
  ptr += 4;
  nTotalBytes += 4;

  nBytes = nMarkers * sizeof(tMarkerData);

  if (nMarkers != Frame->nUnidentifiedMarkers) {
    Frame->nUnidentifiedMarkers = nMarkers;
    Frame->UnidentifiedMarkers
        = (tMarkerData*) realloc(Frame->UnidentifiedMarkers, nBytes);
  }

  memcpy(Frame->UnidentifiedMarkers, ptr, nBytes);
  ptr += nBytes;
  nTotalBytes += nBytes;

  *pptr = ptr;
  return nTotalBytes;
}